

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guess_basis.cc
# Opt level: O0

vector<int,_std::allocator<int>_> *
ipx::GuessBasis(Control *control,Model *model,double *colweights)

{
  vector<int,_std::allocator<int>_> *this;
  reference pvVar1;
  Model *in_RDX;
  value_type_conflict2 *in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  Int i;
  vector<int,_std::allocator<int>_> active;
  vector<int,_std::allocator<int>_> rownumber;
  Int n;
  Int m;
  vector<int,_std::allocator<int>_> *basis;
  int *in_stack_00000118;
  Int *in_stack_00000120;
  vector<int,_std::allocator<int>_> *in_stack_00000128;
  double *in_stack_00000130;
  Model *in_stack_00000138;
  Control *in_stack_00000140;
  int *in_stack_00000160;
  Int *in_stack_00000168;
  vector<int,_std::allocator<int>_> *in_stack_00000170;
  double *in_stack_00000178;
  Model *in_stack_00000180;
  Control *in_stack_00000188;
  value_type_conflict2 *__x;
  Model *this_00;
  allocator_type *in_stack_fffffffffffffef8;
  value_type_conflict2 *in_stack_ffffffffffffff00;
  size_type in_stack_ffffffffffffff08;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff10;
  int local_84;
  int *in_stack_ffffffffffffff88;
  Int *in_stack_ffffffffffffff90;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff98;
  double *in_stack_ffffffffffffffa0;
  Model *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar2;
  vector<int,_std::allocator<int>_> local_48;
  byte local_29;
  Int local_28;
  Int local_24;
  Model *local_18;
  value_type_conflict2 *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_24 = Model::rows(in_RDX);
  local_28 = Model::cols(local_18);
  local_29 = 0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x81dace);
  uVar2 = 0xffffffff;
  std::allocator<int>::allocator((allocator<int> *)0x81dafe);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
             in_stack_fffffffffffffef8);
  std::allocator<int>::~allocator((allocator<int> *)0x81db32);
  std::allocator<int>::allocator((allocator<int> *)0x81db66);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
             in_stack_fffffffffffffef8);
  std::allocator<int>::~allocator((allocator<int> *)0x81db94);
  std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x81dbc8);
  std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x81dbda);
  ProcessFreeColumns(in_stack_00000140,in_stack_00000138,in_stack_00000130,in_stack_00000128,
                     in_stack_00000120,in_stack_00000118);
  std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x81dc31);
  std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x81dc43);
  ProcessSingletons((Control *)CONCAT44(uVar2,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8,
                    in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                    in_stack_ffffffffffffff88);
  this = (vector<int,_std::allocator<int>_> *)
         std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x81dc99)
  ;
  std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x81dcab);
  ProcessRemaining(in_stack_00000188,in_stack_00000180,in_stack_00000178,in_stack_00000170,
                   in_stack_00000168,in_stack_00000160);
  __x = local_10;
  this_00 = local_18;
  for (local_84 = 0; local_84 < local_24; local_84 = local_84 + 1) {
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](&local_48,(long)local_84);
    if (*pvVar1 < 0) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)this_00,__x);
    }
  }
  local_29 = 1;
  std::vector<int,_std::allocator<int>_>::~vector(this);
  std::vector<int,_std::allocator<int>_>::~vector(this);
  if ((local_29 & 1) == 0) {
    std::vector<int,_std::allocator<int>_>::~vector(this);
  }
  return in_RDI;
}

Assistant:

std::vector<Int> GuessBasis(const Control& control, const Model& model,
                            const double* colweights) {
    const Int m = model.rows();
    const Int n = model.cols();

    // basis starts empty and is filled one index at a time. rownumber[i] >= 0
    // iff row i was pivot row when a column was added to the basis. (The
    // specific value has a different meaning in each method.) A column is
    // "active" if it is eligible for being added to the basis.
    std::vector<Int> basis, rownumber(m, -1);
    std::vector<int> active(n+m, 1);

    ProcessFreeColumns(control, model, colweights, &basis, rownumber.data(),
                       active.data());
    ProcessSingletons(control, model, colweights, &basis, rownumber.data(),
                      active.data());
    ProcessRemaining(control, model, colweights, &basis, rownumber.data(),
                     active.data());

    // Complete basis with unit columns.
    for (Int i = 0; i < m; i++) {
        if (rownumber[i] < 0)
            basis.push_back(n+i);
    }
    assert((Int)basis.size() == m);
    return basis;
}